

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O3

void __thiscall re2c::OutputBlock::OutputBlock(OutputBlock *this)

{
  OutputFragment *pOVar1;
  OutputFragment *local_28;
  
  *(undefined8 *)
   ((long)&(this->fragments).
           super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->fragments).
           super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->fragments).
  super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fragments).
  super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->user_start_label)._M_dataplus._M_p = (pointer)&(this->user_start_label).field_2;
  (this->user_start_label)._M_string_length = 0;
  (this->user_start_label).field_2._M_local_buf[0] = '\0';
  this->line = 0;
  pOVar1 = (OutputFragment *)operator_new(0x188);
  pOVar1->type = CODE;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pOVar1->stream);
  pOVar1->indent = 0;
  local_28 = pOVar1;
  std::vector<re2c::OutputFragment*,std::allocator<re2c::OutputFragment*>>::
  emplace_back<re2c::OutputFragment*>
            ((vector<re2c::OutputFragment*,std::allocator<re2c::OutputFragment*>> *)this,&local_28);
  return;
}

Assistant:

OutputBlock::OutputBlock ()
	: fragments ()
	, used_yyaccept (false)
	, force_start_label (false)
	, user_start_label ()
	, line (0)
{
	fragments.push_back (new OutputFragment (OutputFragment::CODE, 0));
}